

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

QTransform * __thiscall
QGraphicsViewPrivate::mapToViewTransform
          (QTransform *__return_storage_ptr__,QGraphicsViewPrivate *this,QGraphicsItem *item)

{
  QGraphicsView *this_00;
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  qreal *pqVar3;
  QTransform *pQVar4;
  QTransform *pQVar5;
  long in_FS_OFFSET;
  byte bVar6;
  double dVar7;
  double dVar8;
  QTransform tr;
  QTransform move;
  QTransform local_118;
  QTransform local_c8;
  QTransform local_78;
  long local_28;
  
  bVar6 = 0;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsView **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  if ((*(uint *)&((item->d_ptr).d)->field_0x161 & 0x20000400) == 0) {
    dVar7 = 0.0;
    dVar8 = 0.0;
    do {
      pQVar1 = (item->d_ptr).d;
      if (pQVar1->transformData != (TransformData *)0x0) goto LAB_0063de75;
      dVar7 = dVar7 + (pQVar1->pos).xp;
      dVar8 = dVar8 + (pQVar1->pos).yp;
      item = pQVar1->parent;
    } while (item != (QGraphicsItem *)0x0);
    item = (QGraphicsItem *)0x0;
LAB_0063de75:
    pqVar3 = (qreal *)&DAT_00704bf8;
    pQVar4 = &local_78;
    for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pQVar4->m_matrix[0][0] = *pqVar3;
      pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
      pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    }
    QTransform::fromTranslate(dVar7,dVar8);
    if (item == (QGraphicsItem *)0x0) {
      QTransform::translate((double)-this->scrollX,(double)-this->scrollY);
      if ((this->field_0x300 & 0x10) != 0) {
        pQVar4 = &local_78;
        pQVar5 = __return_storage_ptr__;
        for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
          pQVar5->m_matrix[0][0] = pQVar4->m_matrix[0][0];
          pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar6 * -2 + 1) * 8);
          pQVar5 = (QTransform *)((long)pQVar5 + ((ulong)bVar6 * -2 + 1) * 8);
        }
        goto LAB_0063df93;
      }
      pQVar4 = &this->matrix;
    }
    else {
      pqVar3 = (qreal *)&DAT_00704bf8;
      pQVar4 = &local_c8;
      for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
        pQVar4->m_matrix[0][0] = *pqVar3;
        pqVar3 = pqVar3 + (ulong)bVar6 * -2 + 1;
        pQVar4 = (QTransform *)((long)pQVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      }
      QGraphicsItem::sceneTransform(&local_c8,item);
      if ((this->field_0x300 & 0x10) == 0) {
        QTransform::operator*=(&local_c8,&this->matrix);
      }
      pQVar4 = &local_118;
      QTransform::operator*(pQVar4,&local_78);
      QTransform::fromTranslate((double)-this->scrollX,(double)-this->scrollY);
    }
    QTransform::operator*(__return_storage_ptr__,pQVar4);
  }
  else {
    QGraphicsView::viewportTransform(&local_78,this_00);
    QGraphicsItem::deviceTransform(__return_storage_ptr__,item,&local_78);
  }
LAB_0063df93:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTransform QGraphicsViewPrivate::mapToViewTransform(const QGraphicsItem *item) const
{
    Q_Q(const QGraphicsView);
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();

    if (item->d_ptr->itemIsUntransformable())
        return item->deviceTransform(q->viewportTransform());

    // Translate-only
    // COMBINE
    QPointF offset;
    const QGraphicsItem *parentItem = item;
    const QGraphicsItemPrivate *itemd;
    do {
        itemd = parentItem->d_ptr.data();
        if (itemd->transformData)
            break;
        offset += itemd->pos;
    } while ((parentItem = itemd->parent));

    QTransform move = QTransform::fromTranslate(offset.x(), offset.y());
    if (!parentItem) {
        move.translate(-scrollX, -scrollY);
        return identityMatrix ? move : matrix * move;
    }
    QTransform tr = parentItem->sceneTransform();
    if (!identityMatrix)
        tr *= matrix;
    return move * tr * QTransform::fromTranslate(-scrollX, -scrollY);
}